

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

char * dumpNodeList(xmlNodePtr list)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *ret;
  xmlNodePtr cur;
  xmlSaveCtxtPtr save;
  xmlBufferPtr buffer;
  xmlNodePtr list_local;
  
  uVar1 = xmlBufferCreate();
  uVar2 = xmlSaveToBuffer(uVar1,"UTF-8",0);
  for (ret = (char *)list; ret != (char *)0x0; ret = *(char **)(ret + 0x30)) {
    xmlSaveTree(uVar2,ret);
  }
  xmlSaveClose(uVar2);
  pcVar3 = (char *)xmlBufferDetach(uVar1);
  xmlBufferFree(uVar1);
  return pcVar3;
}

Assistant:

static char *
dumpNodeList(xmlNodePtr list) {
    xmlBufferPtr buffer;
    xmlSaveCtxtPtr save;
    xmlNodePtr cur;
    char *ret;

    buffer = xmlBufferCreate();
    save = xmlSaveToBuffer(buffer, "UTF-8", 0);
    for (cur = list; cur != NULL; cur = cur->next)
        xmlSaveTree(save, cur);
    xmlSaveClose(save);

    ret = (char *) xmlBufferDetach(buffer);
    xmlBufferFree(buffer);
    return(ret);
}